

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O2

void __thiscall TPZSkylMatrix<double>::CopyFrom(TPZSkylMatrix<double> *this,TPZMatrix<double> *mat)

{
  TPZSkylMatrix<double> *A;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    A = (TPZSkylMatrix<double> *)__dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (A != (TPZSkylMatrix<double> *)0x0) {
      operator=(this,A);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZSkylMatrix<double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.h",
             0x74);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }